

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

void __thiscall
SQCompilation::SQParser::checkSuspiciousUnaryOp
          (SQParser *this,SQInteger pprevTok,SQInteger tok,uint pprevFlags)

{
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  SQParser *in_RDI;
  char *local_30;
  
  if ((((in_RDX == 0x2b) || (in_RDX == 0x2d)) &&
      ((in_RDI->_expression_context == SQE_ARRAY_ELEM ||
       (in_RDI->_expression_context == SQE_FUNCTION_ARG)))) &&
     ((((in_ECX & 3) != 0 && (in_RSI != 0x2c)) && (((in_RDI->_lex)._prevflags & 2) == 0)))) {
    if (in_RDX == 0x2b) {
      local_30 = "++";
    }
    else {
      local_30 = "--";
    }
    local_30 = local_30 + 1;
    reportDiagnostic(in_RDI,0x70,local_30);
  }
  return;
}

Assistant:

void SQParser::checkSuspiciousUnaryOp(SQInteger pprevTok, SQInteger tok, unsigned pprevFlags) {
  if (tok == _SC('+') || tok == _SC('-')) {
    if (_expression_context == SQE_ARRAY_ELEM || _expression_context == SQE_FUNCTION_ARG) {
      if ((pprevFlags & (TF_PREP_EOL | TF_PREP_SPACE)) && (pprevTok != _SC(',')) && ((_lex._prevflags & TF_PREP_SPACE) == 0)) {
        reportDiagnostic(DiagnosticsId::DI_NOT_UNARY_OP, tok == _SC('+') ? "+" : "-");
      }
    }
  }
}